

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroIO.cpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
* __thiscall OpenMD::HydroIO::parseHydroFile(HydroIO *this,string *f)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ParseErrorCode parseErrorCode;
  undefined8 uVar4;
  size_t sVar5;
  char *pcVar6;
  value_type *pvVar7;
  Type this_00;
  Ch *pCVar8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar9;
  double *pdVar10;
  string *in_RDX;
  long in_RSI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
  *in_RDI;
  double dVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>,_bool>
  pVar12;
  uint j;
  uint i_1;
  uint i;
  Mat6x6d Xi;
  Vector3d cor;
  string name;
  HydroProp *hp;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *entry;
  ValueIterator __end1;
  ValueIterator __begin1;
  ConstArray *__range1;
  Value *entries;
  IStreamWrapper isw;
  ifstream ifs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
  *props;
  undefined4 in_stack_fffffffffffff938;
  SizeType in_stack_fffffffffffff93c;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>
  in_stack_fffffffffffff940;
  Ch *in_stack_fffffffffffff948;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffff950;
  value_type *this_01;
  HydroProp *in_stack_fffffffffffff960;
  char *in_stack_fffffffffffff988;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffff990;
  string local_440 [36];
  uint local_41c;
  uint local_418;
  uint local_414;
  RectMatrix<double,_6U,_6U> local_410;
  Vector<double,_3U> local_2f0;
  string local_2d8 [32];
  value_type *local_2b8;
  ValueIterator local_2b0;
  ValueIterator local_2a8;
  ValueIterator local_2a0;
  GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  local_298;
  GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  *local_290;
  Type local_288;
  undefined1 local_228 [527];
  byte local_19;
  string *local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
         *)0x36177f);
  std::ifstream::ifstream(local_228,local_18,_S_in);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    uVar4 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"HydroIO: Cannot open file: %s\n",uVar4);
    painCave.isFatal = 1;
    simError();
  }
  iVar3 = std::istream::peek();
  if (iVar3 != -1) {
    rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::
    BasicIStreamWrapper((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
                        in_stack_fffffffffffff940._M_node,
                        (basic_istream<char,_std::char_traits<char>_> *)
                        CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
    ::ParseStream<rapidjson::BasicIStreamWrapper<std::istream>>
              ((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                *)in_stack_fffffffffffff940._M_node,
               (BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
               CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
    bVar2 = rapidjson::
            GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::HasParseError((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                             *)0x3618b6);
    if (bVar2) {
      uVar4 = std::__cxx11::string::c_str();
      sVar5 = rapidjson::
              GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::GetErrorOffset((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                                *)0x3618f5);
      parseErrorCode =
           rapidjson::
           GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
           ::GetParseError((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                            *)0x361910);
      pcVar6 = rapidjson::GetParseError_En(parseErrorCode);
      snprintf(painCave.errMsg,2000,"HydroIO: JSON parse error in file %s\n\tError: %zu : %s\n",
               uVar4,sVar5,pcVar6);
      painCave.isFatal = 1;
      simError();
    }
    bVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsObject((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)(in_RSI + 0x58));
    if (!bVar2) {
      snprintf(painCave.errMsg,2000,"HydroIO: OpenMD-Hydro should be a single object.\n");
      painCave.isFatal = 1;
      simError();
    }
    bVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    if (!bVar2) {
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"HydroIO: File %s does not have a OpenMD-Hydro object.\n",uVar4)
      ;
      painCave.isFatal = 1;
      simError();
    }
  }
  local_288 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GetArray((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
  local_290 = &local_298;
  local_2a0 = rapidjson::
              GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
              ::begin((GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                       *)0x361acb);
  local_2a8 = rapidjson::
              GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
              ::end((GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                     *)0x361af2);
  for (; local_2a0 != local_2a8; local_2a0 = local_2a0 + 1) {
    local_2b0 = local_2a0;
    pvVar7 = (value_type *)operator_new(0x280);
    HydroProp::HydroProp(in_stack_fffffffffffff960);
    local_2b8 = pvVar7;
    std::__cxx11::string::string(local_2d8);
    Vector3<double>::Vector3((Vector3<double> *)0x361ba6);
    SquareMatrix<double,_6>::SquareMatrix
              ((SquareMatrix<double,_6> *)in_stack_fffffffffffff940._M_node);
    this_00 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)in_stack_fffffffffffff940._M_node,
                         (char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
    pCVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(this_00);
    std::__cxx11::string::operator=(local_2d8,pCVar8);
    for (local_414 = 0; local_414 < 3; local_414 = local_414 + 1) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
      operator[]<char_const>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)in_stack_fffffffffffff940._M_node,
                 (char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
      pGVar9 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::operator[]((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)in_stack_fffffffffffff940._M_node,in_stack_fffffffffffff93c);
      dVar11 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetDouble(pGVar9);
      pdVar10 = Vector<double,_3U>::operator[](&local_2f0,local_414);
      *pdVar10 = dVar11;
    }
    for (local_418 = 0; local_418 < 6; local_418 = local_418 + 1) {
      for (local_41c = 0; local_41c < 6; local_41c = local_41c + 1) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
        ::operator[]<char_const>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)in_stack_fffffffffffff940._M_node,
                   (char *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::operator[]((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)in_stack_fffffffffffff940._M_node,in_stack_fffffffffffff93c);
        pGVar9 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::operator[]((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)in_stack_fffffffffffff940._M_node,in_stack_fffffffffffff93c);
        dVar11 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetDouble(pGVar9);
        in_stack_fffffffffffff960 =
             (HydroProp *)RectMatrix<double,_6U,_6U>::operator()(&local_410,local_418,local_41c);
        *(double *)&in_stack_fffffffffffff960->name_ = dVar11;
      }
    }
    std::__cxx11::string::string(local_440,local_2d8);
    HydroProp::setName((HydroProp *)in_stack_fffffffffffff940._M_node,
                       (string *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
    std::__cxx11::string::~string(local_440);
    this_01 = local_2b8;
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffff940._M_node,
               (Vector3<double> *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
    HydroProp::setCenterOfResistance
              ((HydroProp *)in_stack_fffffffffffff940._M_node,
               (Vector3d *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
    pvVar7 = local_2b8;
    SquareMatrix<double,_6>::SquareMatrix
              ((SquareMatrix<double,_6> *)in_stack_fffffffffffff940._M_node,
               (SquareMatrix<double,_6> *)
               CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
    HydroProp::setResistanceTensor
              ((HydroProp *)in_stack_fffffffffffff940._M_node,
               (Mat6x6d *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
    SquareMatrix<double,_6>::~SquareMatrix((SquareMatrix<double,_6> *)0x361ea2);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_OpenMD::HydroProp_*&,_true>
              (this_01,&pvVar7->first,(HydroProp **)in_stack_fffffffffffff940._M_node);
    pVar12 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
             ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                       *)this_01,pvVar7);
    in_stack_fffffffffffff940 = pVar12.first._M_node;
    in_stack_fffffffffffff93c = CONCAT13(pVar12.second,(int3)in_stack_fffffffffffff93c);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>
             *)0x361f06);
    SquareMatrix<double,_6>::~SquareMatrix((SquareMatrix<double,_6> *)0x361f13);
    std::__cxx11::string::~string(local_2d8);
  }
  rapidjson::
  GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  ::~GenericArray(&local_298);
  local_19 = 1;
  std::ifstream::~ifstream(local_228);
  if ((local_19 & 1) == 0) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
            *)0x362006);
  }
  return in_RDI;
}

Assistant:

map<string, HydroProp*> HydroIO::parseHydroFile(const string& f) {
    map<string, HydroProp*> props;

    ifstream ifs(f);

    if (!ifs.good()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "HydroIO: Cannot open file: %s\n", f.c_str());
      painCave.isFatal = 1;
      simError();
    }

#if defined(NLOHMANN_JSON)
    json ij = json::parse(ifs);

    auto& entries = ij["OpenMD-Hydro"];

    for (auto& entry : entries) {
      HydroProp* hp = new HydroProp();
      std::string name;
      Vector3d cor;
      Mat6x6d Xi;

      name = entry["name"].get<std::string>();

      for (unsigned int i = 0; i < 3; i++) {
        cor[i] = entry["centerOfResistance"].get<vector<RealType>>()[i];
      }

      for (unsigned int i = 0; i < 6; i++) {
        for (unsigned int j = 0; j < 6; j++) {
          Xi(i, j) =
              entry["resistanceTensor"].get<vector<vector<RealType>>>()[i][j];
        }
      }

      hp->setName(name);
      hp->setCenterOfResistance(cor);
      hp->setResistanceTensor(Xi);
      props.insert(map<string, HydroProp*>::value_type(name, hp));
    }
#elif defined(RAPID_JSON)
    // Parse entire file into memory once, then reuse d_ for subsequent
    // hydroProps.

    if (ifs.peek() != EOF) {
      rapidjson::IStreamWrapper isw(ifs);
      d_.ParseStream(isw);
      if (d_.HasParseError()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "HydroIO: JSON parse error in file %s\n"
                 "\tError: %zu : %s\n",
                 f.c_str(), d_.GetErrorOffset(),
                 rapidjson::GetParseError_En(d_.GetParseError()));
        painCave.isFatal = 1;
        simError();
      }
      if (!d_.IsObject()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "HydroIO: OpenMD-Hydro should be a single object.\n");
        painCave.isFatal = 1;
        simError();
      }
      // OpenMD-Hydro has a single object, but check that it's really
      // OpenMD-Hydro
      if (!d_.HasMember("OpenMD-Hydro")) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "HydroIO: File %s does not have a OpenMD-Hydro object.\n",
                 f.c_str());
        painCave.isFatal = 1;
        simError();
      }
    }
    const Value& entries = d_["OpenMD-Hydro"];
    for (auto& entry : entries.GetArray()) {
      HydroProp* hp = new HydroProp();
      std::string name;
      Vector3d cor;
      Mat6x6d Xi;

      name = entry["name"].GetString();

      for (unsigned int i = 0; i < 3; i++) {
        cor[i] = entry["centerOfResistance"][i].GetDouble();
      }

      for (unsigned int i = 0; i < 6; i++) {
        for (unsigned int j = 0; j < 6; j++) {
          Xi(i, j) = entry["resistanceTensor"][i][j].GetDouble();
        }
      }

      hp->setName(name);
      hp->setCenterOfResistance(cor);
      hp->setResistanceTensor(Xi);
      props.insert(map<string, HydroProp*>::value_type(name, hp));
    }
#endif
    return props;
  }